

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fft.h
# Opt level: O2

void bitrv2(int n,int *ip,float *a)

{
  undefined8 uVar1;
  int iVar2;
  ulong uVar3;
  uint uVar4;
  int iVar5;
  long lVar6;
  int iVar7;
  ulong uVar8;
  int iVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  
  *ip = 0;
  uVar4 = 1;
  while( true ) {
    if (n <= (int)(uVar4 * 8)) break;
    n = n >> 1;
    uVar3 = 0;
    if (0 < (int)uVar4) {
      uVar3 = (ulong)uVar4;
    }
    for (uVar8 = 0; uVar3 != uVar8; uVar8 = uVar8 + 1) {
      ip[(long)(int)uVar4 + uVar8] = ip[uVar8] + n;
    }
    uVar4 = uVar4 * 2;
  }
  iVar2 = uVar4 * 2;
  if (uVar4 * 8 == n) {
    lVar6 = 0;
    uVar3 = 0;
    if (0 < (int)uVar4) {
      uVar3 = (ulong)uVar4;
    }
    iVar7 = uVar4 * 4;
    for (uVar8 = 0; uVar8 != uVar3; uVar8 = uVar8 + 1) {
      for (lVar12 = 0; lVar6 != lVar12; lVar12 = lVar12 + 2) {
        iVar5 = ip[uVar8] + (int)lVar12;
        lVar10 = (long)*(int *)((long)ip + lVar12 * 2) + (long)((int)uVar8 * 2);
        uVar1 = *(undefined8 *)(a + iVar5);
        *(undefined8 *)(a + iVar5) = *(undefined8 *)(a + lVar10);
        *(undefined8 *)(a + lVar10) = uVar1;
        iVar9 = (int)lVar10 + iVar7;
        uVar1 = *(undefined8 *)(a + (iVar5 + iVar2));
        *(undefined8 *)(a + (iVar5 + iVar2)) = *(undefined8 *)(a + iVar9);
        *(undefined8 *)(a + iVar9) = uVar1;
        iVar9 = iVar9 + uVar4 * -2;
        uVar1 = *(undefined8 *)(a + (iVar5 + iVar7));
        *(undefined8 *)(a + (iVar5 + iVar7)) = *(undefined8 *)(a + iVar9);
        *(undefined8 *)(a + iVar9) = uVar1;
        iVar5 = iVar5 + uVar4 * 6;
        uVar1 = *(undefined8 *)(a + iVar5);
        *(undefined8 *)(a + iVar5) = *(undefined8 *)(a + (iVar9 + iVar7));
        *(undefined8 *)(a + (iVar9 + iVar7)) = uVar1;
      }
      lVar12 = (long)(int)((uVar4 + (int)uVar8) * 2) + (long)ip[uVar8];
      iVar5 = (int)lVar12 + iVar2;
      uVar1 = *(undefined8 *)(a + lVar12);
      *(undefined8 *)(a + lVar12) = *(undefined8 *)(a + iVar5);
      *(undefined8 *)(a + iVar5) = uVar1;
      lVar6 = lVar6 + 2;
    }
  }
  else {
    for (lVar6 = 1; lVar6 < (int)uVar4; lVar6 = lVar6 + 1) {
      lVar10 = (long)ip[lVar6];
      for (lVar12 = 0; lVar6 != lVar12; lVar12 = lVar12 + 1) {
        lVar11 = (long)ip[lVar12] + (long)((int)lVar6 * 2);
        uVar1 = *(undefined8 *)(a + lVar10 + lVar12 * 2);
        *(undefined8 *)(a + lVar10 + lVar12 * 2) = *(undefined8 *)(a + lVar11);
        *(undefined8 *)(a + lVar11) = uVar1;
        iVar7 = (int)lVar11 + iVar2;
        uVar1 = *(undefined8 *)(a + (long)iVar2 + lVar10 + lVar12 * 2);
        *(undefined8 *)(a + (long)iVar2 + lVar10 + lVar12 * 2) = *(undefined8 *)(a + iVar7);
        *(undefined8 *)(a + iVar7) = uVar1;
      }
    }
  }
  return;
}

Assistant:

void bitrv2(int n, int *ip, float *a)
{
    int j, j1, k, k1, l, m, m2;
    float xr, xi, yr, yi;

    ip[0] = 0;
    l = n;
    m = 1;
    while ((m << 3) < l) {
        l >>= 1;
        for (j = 0; j < m; j++) {
            ip[m + j] = ip[j] + l;
        }
        m <<= 1;
    }
    m2 = 2 * m;
    if ((m << 3) == l) {
        for (k = 0; k < m; k++) {
            for (j = 0; j < k; j++) {
                j1 = 2 * j + ip[k];
                k1 = 2 * k + ip[j];
                xr = a[j1];
                xi = a[j1 + 1];
                yr = a[k1];
                yi = a[k1 + 1];
                a[j1] = yr;
                a[j1 + 1] = yi;
                a[k1] = xr;
                a[k1 + 1] = xi;
                j1 += m2;
                k1 += 2 * m2;
                xr = a[j1];
                xi = a[j1 + 1];
                yr = a[k1];
                yi = a[k1 + 1];
                a[j1] = yr;
                a[j1 + 1] = yi;
                a[k1] = xr;
                a[k1 + 1] = xi;
                j1 += m2;
                k1 -= m2;
                xr = a[j1];
                xi = a[j1 + 1];
                yr = a[k1];
                yi = a[k1 + 1];
                a[j1] = yr;
                a[j1 + 1] = yi;
                a[k1] = xr;
                a[k1 + 1] = xi;
                j1 += m2;
                k1 += 2 * m2;
                xr = a[j1];
                xi = a[j1 + 1];
                yr = a[k1];
                yi = a[k1 + 1];
                a[j1] = yr;
                a[j1 + 1] = yi;
                a[k1] = xr;
                a[k1 + 1] = xi;
            }
            j1 = 2 * k + m2 + ip[k];
            k1 = j1 + m2;
            xr = a[j1];
            xi = a[j1 + 1];
            yr = a[k1];
            yi = a[k1 + 1];
            a[j1] = yr;
            a[j1 + 1] = yi;
            a[k1] = xr;
            a[k1 + 1] = xi;
        }
    } else {
        for (k = 1; k < m; k++) {
            for (j = 0; j < k; j++) {
                j1 = 2 * j + ip[k];
                k1 = 2 * k + ip[j];
                xr = a[j1];
                xi = a[j1 + 1];
                yr = a[k1];
                yi = a[k1 + 1];
                a[j1] = yr;
                a[j1 + 1] = yi;
                a[k1] = xr;
                a[k1 + 1] = xi;
                j1 += m2;
                k1 += m2;
                xr = a[j1];
                xi = a[j1 + 1];
                yr = a[k1];
                yi = a[k1 + 1];
                a[j1] = yr;
                a[j1 + 1] = yi;
                a[k1] = xr;
                a[k1 + 1] = xi;
            }
        }
    }
}